

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O1

int GetPWMSSC32(SSC32 *pSSC32,int channel,int *pPw)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  char *__s;
  uint uVar4;
  ulong uVar5;
  char recvbuf [2];
  char sendbuf [512];
  ushort local_22a;
  uint8 local_228 [512];
  
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"#%dPI\r",channel);
  sVar2 = strlen((char *)local_228);
  iVar1 = WriteDataSSC32(pSSC32,local_228,(int)sVar2,pSSC32->bytedelayus);
  if (iVar1 == 0) {
    if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_228,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    local_22a = 0;
    iVar1 = (pSSC32->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pSSC32->RS232Port).s;
      uVar5 = 0;
      do {
        sVar3 = recv(iVar1,local_228 + (uVar5 - 2),(long)(2 - (int)uVar5),0);
        if ((int)sVar3 < 1) goto LAB_0011bfa2;
        uVar4 = (int)uVar5 + (int)sVar3;
        uVar5 = (ulong)uVar4;
      } while ((int)uVar4 < 2);
    }
    else {
      if (iVar1 != 0) {
LAB_0011bfa2:
        __s = "Error reading data from a SSC32. ";
        goto LAB_0011bfa9;
      }
      iVar1 = *(int *)&(pSSC32->RS232Port).hDev;
      uVar5 = 0;
      do {
        sVar3 = read(iVar1,local_228 + (uVar5 - 2),(ulong)(2 - (int)uVar5));
        if ((int)sVar3 < 1) goto LAB_0011bfa2;
        uVar4 = (int)uVar5 + (int)sVar3;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < 2);
    }
    if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(&local_22a,2,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    *pPw = (uint)local_22a;
    iVar1 = 0;
  }
  else {
    __s = "Error writing data to a SSC32. ";
LAB_0011bfa9:
    puts(__s);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetPWMSSC32(SSC32* pSSC32, int channel, int* pPw)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[2];
	int recvbuflen = 0;
	unsigned short pw = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "#%dPI\r", channel);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	// pw in us as a 16 bit integer.
	memcpy((char*)&pw, recvbuf, sizeof(unsigned short));
	*pPw = pw;

	return EXIT_SUCCESS;
}